

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFEmitter.cpp
# Opt level: O2

void EmitDebugLineInternal
               (raw_ostream *RealOS,Data *DI,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *computedLengths)

{
  string **this;
  uint32_t uVar1;
  pointer pLVar2;
  pointer pSVar3;
  pointer pFVar4;
  LineTableOpcode *pLVar5;
  uint64_t *puVar6;
  string *psVar7;
  size_t __n;
  bool IsLittleEndian;
  bool IsLittleEndian_00;
  undefined1 extraout_DL;
  undefined1 IsLittleEndian_01;
  bool IsLittleEndian_02;
  bool IsLittleEndian_03;
  bool IsLittleEndian_04;
  bool IsLittleEndian_05;
  bool IsLittleEndian_06;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *pvVar8;
  void *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar9;
  undefined8 extraout_RDX_05;
  uchar *puVar10;
  pointer pSVar11;
  pointer pFVar12;
  LineTableOpcode *pLVar13;
  pointer pLVar14;
  uchar *puVar15;
  uint64_t *puVar16;
  undefined1 local_138 [8];
  raw_string_ostream OS;
  size_t Size;
  uint64_t local_f8;
  uint64_t uStack_f0;
  uint64_t local_e8;
  File local_e0;
  uchar *local_b8;
  uchar *local_b0;
  uint64_t *local_a0;
  uint64_t *local_98;
  size_type *local_88;
  string Buffer;
  
  pLVar14 = (DI->DebugLines).
            super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pLVar2 = (DI->DebugLines).
           super__Vector_base<llvm::DWARFYAML::LineTable,_std::allocator<llvm::DWARFYAML::LineTable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this = &OS.OS;
  do {
    if (pLVar14 == pLVar2) {
      return;
    }
    local_88 = &Buffer._M_string_length;
    Buffer._M_dataplus._M_p = (pointer)0x0;
    Buffer._M_string_length._0_1_ = 0;
    OS.super_raw_ostream.OutBufCur._0_4_ = 1;
    OS.super_raw_ostream._vptr_raw_ostream = (_func_int **)0x0;
    OS.super_raw_ostream.OutBufStart = (char *)0x0;
    OS.super_raw_ostream.OutBufEnd = (char *)0x0;
    local_138 = (undefined1  [8])&PTR__raw_string_ostream_01129208;
    OS.super_raw_ostream._32_8_ = &local_88;
    uVar1 = (pLVar14->Length).TotalLength;
    writeInteger<unsigned_short>(pLVar14->Version,(raw_ostream *)local_138,DI->IsLittleEndian);
    __n = (size_t)DI->IsLittleEndian;
    writeVariableSizedInteger
              (pLVar14->PrologueLength,(ulong)(uVar1 == 0xffffffff) * 4 + 4,(raw_ostream *)local_138
               ,DI->IsLittleEndian);
    writeInteger<unsigned_char>(pLVar14->MinInstLength,(raw_ostream *)local_138,IsLittleEndian);
    IsLittleEndian_01 = IsLittleEndian_00;
    if (3 < pLVar14->Version) {
      writeInteger<unsigned_char>(pLVar14->MaxOpsPerInst,(raw_ostream *)local_138,IsLittleEndian_00)
      ;
      IsLittleEndian_01 = extraout_DL;
    }
    writeInteger<unsigned_char>
              (pLVar14->DefaultIsStmt,(raw_ostream *)local_138,(bool)IsLittleEndian_01);
    writeInteger<unsigned_char>(pLVar14->LineBase,(raw_ostream *)local_138,IsLittleEndian_02);
    writeInteger<unsigned_char>(pLVar14->LineRange,(raw_ostream *)local_138,IsLittleEndian_03);
    writeInteger<unsigned_char>(pLVar14->OpcodeBase,(raw_ostream *)local_138,IsLittleEndian_04);
    puVar15 = (pLVar14->StandardOpcodeLengths).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
    pvVar8 = extraout_RDX;
    for (puVar10 = (pLVar14->StandardOpcodeLengths).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start; puVar10 != puVar15; puVar10 = puVar10 + 1) {
      writeInteger<unsigned_char>(*puVar10,(raw_ostream *)local_138,SUB81(pvVar8,0));
      pvVar8 = extraout_RDX_00;
    }
    pSVar3 = (pLVar14->IncludeDirs).
             super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pSVar11 = (pLVar14->IncludeDirs).
                   super__Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>._M_impl.
                   super__Vector_impl_data._M_start; pSVar11 != pSVar3; pSVar11 = pSVar11 + 1) {
      llvm::raw_ostream::write
                ((raw_ostream *)local_138,(int)pSVar11->Data,(void *)pSVar11->Length,__n);
      llvm::raw_ostream::write((raw_ostream *)local_138,0,__buf,__n);
      pvVar8 = extraout_RDX_01;
    }
    llvm::raw_ostream::write((raw_ostream *)local_138,0,pvVar8,__n);
    pFVar4 = (pLVar14->Files).
             super__Vector_base<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pvVar8 = extraout_RDX_02;
    for (pFVar12 = (pLVar14->Files).
                   super__Vector_base<llvm::DWARFYAML::File,_std::allocator<llvm::DWARFYAML::File>_>
                   ._M_impl.super__Vector_impl_data._M_start; pFVar12 != pFVar4;
        pFVar12 = pFVar12 + 1) {
      local_e8 = pFVar12->Length;
      OS.OS = (string *)(pFVar12->Name).Data;
      Size = (pFVar12->Name).Length;
      local_f8 = pFVar12->DirIdx;
      uStack_f0 = pFVar12->ModTime;
      EmitFileEntry((raw_ostream *)local_138,(File *)this);
      pvVar8 = extraout_RDX_03;
    }
    llvm::raw_ostream::write((raw_ostream *)local_138,0,pvVar8,__n);
    pLVar5 = (pLVar14->Opcodes).
             super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar13 = (pLVar14->Opcodes).
              super__Vector_base<llvm::DWARFYAML::LineTableOpcode,_std::allocator<llvm::DWARFYAML::LineTableOpcode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    while (pLVar13 != pLVar5) {
      llvm::DWARFYAML::LineTableOpcode::LineTableOpcode((LineTableOpcode *)this,pLVar13);
      Buffer.field_2._8_8_ = pLVar13;
      writeInteger<unsigned_char>((byte)OS.OS,(raw_ostream *)local_138,IsLittleEndian_05);
      puVar6 = local_98;
      if ((byte)OS.OS == 0) {
        llvm::encodeULEB128(Size,(raw_ostream *)local_138,0);
        writeInteger<unsigned_char>((uchar)local_f8,(raw_ostream *)local_138,IsLittleEndian_06);
        puVar10 = local_b0;
        uVar9 = extraout_RDX_04;
        puVar15 = local_b8;
        switch((undefined4)local_f8) {
        case 1:
          break;
        case 2:
        case 4:
          writeVariableSizedInteger
                    (uStack_f0,
                     (ulong)((DI->CompileUnits).
                             super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>
                             ._M_impl.super__Vector_impl_data._M_start)->AddrSize,
                     (raw_ostream *)local_138,DI->IsLittleEndian);
          break;
        case 3:
          EmitFileEntry((raw_ostream *)local_138,&local_e0);
          break;
        default:
          for (; puVar15 != puVar10; puVar15 = puVar15 + 1) {
            writeInteger<unsigned_char>(*puVar15,(raw_ostream *)local_138,SUB81(uVar9,0));
            uVar9 = extraout_RDX_05;
          }
        }
      }
      else if ((byte)OS.OS < pLVar14->OpcodeBase) {
        puVar16 = local_a0;
        switch((byte)OS.OS) {
        case 1:
        case 6:
        case 7:
        case 8:
        case 10:
        case 0xb:
          break;
        case 2:
        case 4:
        case 5:
        case 0xc:
          llvm::encodeULEB128(uStack_f0,(raw_ostream *)local_138,0);
          break;
        case 3:
          llvm::encodeSLEB128(local_e8,(raw_ostream *)local_138,0);
          break;
        case 9:
          writeInteger<unsigned_short>
                    ((unsigned_short)uStack_f0,(raw_ostream *)local_138,DI->IsLittleEndian);
          break;
        default:
          for (; puVar16 != puVar6; puVar16 = puVar16 + 1) {
            llvm::encodeULEB128(*puVar16,(raw_ostream *)local_138,0);
          }
        }
      }
      llvm::DWARFYAML::LineTableOpcode::~LineTableOpcode((LineTableOpcode *)this);
      pLVar13 = (LineTableOpcode *)(Buffer.field_2._8_8_ + 0x80);
    }
    psVar7 = llvm::raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_138);
    OS.OS = (string *)psVar7->_M_string_length;
    if ((string *)0xfffffffe < OS.OS) {
      llvm::llvm_unreachable_internal
                ("Table is too big",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFEmitter.cpp"
                 ,0x166);
    }
    if (computedLengths != (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (computedLengths,(value_type_conflict3 *)this);
    }
    writeInteger<unsigned_int>((uint)OS.OS,RealOS,DI->IsLittleEndian);
    psVar7 = llvm::raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_138);
    llvm::raw_ostream::operator<<(RealOS,psVar7);
    llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_138);
    std::__cxx11::string::~string((string *)&local_88);
    pLVar14 = pLVar14 + 1;
  } while( true );
}

Assistant:

static void EmitDebugLineInternal(raw_ostream &RealOS,
                                  const DWARFYAML::Data &DI,
                                  std::vector<size_t>* computedLengths) {
  for (auto &LineTable : DI.DebugLines) {
    // XXX BINARYEN We need to update each line table's length. Write to a
    // temp stream first, then get the size from that.
    std::string Buffer;
    raw_string_ostream OS(Buffer);

    // XXX BINARYEN writeInitialLength(LineTable.Length, OS, DI.IsLittleEndian);

    uint64_t SizeOfPrologueLength = LineTable.Length.isDWARF64() ? 8 : 4;
    writeInteger((uint16_t)LineTable.Version, OS, DI.IsLittleEndian);
    writeVariableSizedInteger(LineTable.PrologueLength, SizeOfPrologueLength,
                              OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.MinInstLength, OS, DI.IsLittleEndian);
    if (LineTable.Version >= 4)
      writeInteger((uint8_t)LineTable.MaxOpsPerInst, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.DefaultIsStmt, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineBase, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.LineRange, OS, DI.IsLittleEndian);
    writeInteger((uint8_t)LineTable.OpcodeBase, OS, DI.IsLittleEndian);

    for (auto OpcodeLength : LineTable.StandardOpcodeLengths)
      writeInteger((uint8_t)OpcodeLength, OS, DI.IsLittleEndian);

    for (auto IncludeDir : LineTable.IncludeDirs) {
      OS.write(IncludeDir.data(), IncludeDir.size());
      OS.write('\0');
    }
    OS.write('\0');

    for (auto File : LineTable.Files)
      EmitFileEntry(OS, File);
    OS.write('\0');

    for (auto Op : LineTable.Opcodes) {
      writeInteger((uint8_t)Op.Opcode, OS, DI.IsLittleEndian);
      if (Op.Opcode == 0) {
        encodeULEB128(Op.ExtLen, OS);
        writeInteger((uint8_t)Op.SubOpcode, OS, DI.IsLittleEndian);
        switch (Op.SubOpcode) {
        case dwarf::DW_LNE_set_address:
        case dwarf::DW_LNE_set_discriminator:
          writeVariableSizedInteger(Op.Data, DI.CompileUnits[0].AddrSize, OS,
                                    DI.IsLittleEndian);
          break;
        case dwarf::DW_LNE_define_file:
          EmitFileEntry(OS, Op.FileEntry);
          break;
        case dwarf::DW_LNE_end_sequence:
          break;
        default:
          for (auto OpByte : Op.UnknownOpcodeData)
            writeInteger((uint8_t)OpByte, OS, DI.IsLittleEndian);
        }
      } else if (Op.Opcode < LineTable.OpcodeBase) {
        switch (Op.Opcode) {
        case dwarf::DW_LNS_copy:
        case dwarf::DW_LNS_negate_stmt:
        case dwarf::DW_LNS_set_basic_block:
        case dwarf::DW_LNS_const_add_pc:
        case dwarf::DW_LNS_set_prologue_end:
        case dwarf::DW_LNS_set_epilogue_begin:
          break;

        case dwarf::DW_LNS_advance_pc:
        case dwarf::DW_LNS_set_file:
        case dwarf::DW_LNS_set_column:
        case dwarf::DW_LNS_set_isa:
          encodeULEB128(Op.Data, OS);
          break;

        case dwarf::DW_LNS_advance_line:
          encodeSLEB128(Op.SData, OS);
          break;

        case dwarf::DW_LNS_fixed_advance_pc:
          writeInteger((uint16_t)Op.Data, OS, DI.IsLittleEndian);
          break;

        default:
          for (auto OpData : Op.StandardOpcodeData) {
            encodeULEB128(OpData, OS);
          }
        }
      }
    }
    // XXX BINARYEN Write to the actual stream, with the proper size.
    // We assume for now that the length fits in 32 bits.
    size_t Size = OS.str().size();
    if (Size >= UINT32_MAX) {
      llvm_unreachable("Table is too big");
    }
    if (computedLengths) {
      computedLengths->push_back(Size);
    }
    writeInteger((uint32_t)Size, RealOS, DI.IsLittleEndian);
    RealOS << OS.str();
  }
}